

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VtabSavepoint(sqlite3 *db,int op,int iSavepoint)

{
  VTable *pVTab;
  sqlite3_module *psVar1;
  int iVar2;
  _func_int_sqlite3_vtab_ptr_int *p_Var3;
  long lVar4;
  
  iVar2 = 0;
  if ((db->aVTrans != (VTable **)0x0) && (0 < db->nVTrans)) {
    lVar4 = 0;
    do {
      pVTab = db->aVTrans[lVar4];
      iVar2 = 0;
      if ((pVTab->pVtab != (sqlite3_vtab *)0x0) &&
         (psVar1 = pVTab->pMod->pModule, 1 < psVar1->iVersion)) {
        pVTab->nRef = pVTab->nRef + 1;
        if (op == 2) {
          p_Var3 = psVar1->xRollbackTo;
        }
        else if (op == 0) {
          p_Var3 = psVar1->xSavepoint;
          pVTab->iSavepoint = iSavepoint + 1;
        }
        else {
          p_Var3 = psVar1->xRelease;
        }
        iVar2 = 0;
        if ((p_Var3 != (_func_int_sqlite3_vtab_ptr_int *)0x0) && (iSavepoint < pVTab->iSavepoint)) {
          iVar2 = (*p_Var3)(pVTab->pVtab,iSavepoint);
        }
        sqlite3VtabUnlock(pVTab);
      }
    } while ((iVar2 == 0) && (lVar4 = lVar4 + 1, lVar4 < db->nVTrans));
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3VtabSavepoint(sqlite3 *db, int op, int iSavepoint){
  int rc = SQLITE_OK;

  assert( op==SAVEPOINT_RELEASE||op==SAVEPOINT_ROLLBACK||op==SAVEPOINT_BEGIN );
  assert( iSavepoint>=-1 );
  if( db->aVTrans ){
    int i;
    for(i=0; rc==SQLITE_OK && i<db->nVTrans; i++){
      VTable *pVTab = db->aVTrans[i];
      const sqlite3_module *pMod = pVTab->pMod->pModule;
      if( pVTab->pVtab && pMod->iVersion>=2 ){
        int (*xMethod)(sqlite3_vtab *, int);
        sqlite3VtabLock(pVTab);
        switch( op ){
          case SAVEPOINT_BEGIN:
            xMethod = pMod->xSavepoint;
            pVTab->iSavepoint = iSavepoint+1;
            break;
          case SAVEPOINT_ROLLBACK:
            xMethod = pMod->xRollbackTo;
            break;
          default:
            xMethod = pMod->xRelease;
            break;
        }
        if( xMethod && pVTab->iSavepoint>iSavepoint ){
          rc = xMethod(pVTab->pVtab, iSavepoint);
        }
        sqlite3VtabUnlock(pVTab);
      }
    }
  }
  return rc;
}